

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O2

bool __thiscall
Glucose::ClausesBuffer::getClause
          (ClausesBuffer *this,int threadId,int *threadOrigin,vec<Glucose::Lit> *resultClause,
          bool firstFound)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  Lit local_3c;
  long local_38;
  
  puVar1 = (this->lastOfThread).data;
  local_38 = (long)threadId;
  uVar8 = puVar1[local_38];
  uVar6 = this->first;
  uVar3 = this->maxsize;
  uVar9 = uVar8 + 1;
  if (uVar8 + 1 == uVar3) {
    uVar9 = 0;
  }
  if (uVar9 == uVar6) {
    return false;
  }
  uVar9 = this->last;
  if (uVar9 <= uVar8 || uVar6 <= uVar9) {
    if ((uVar8 <= uVar6) || (uVar9 <= uVar8 && uVar6 <= uVar9)) goto LAB_0011947a;
  }
  uVar8 = uVar9;
LAB_0011947a:
  if (firstFound) {
    uVar9 = uVar8 + 1;
  }
  else {
    puVar2 = (this->elems).data;
    while( true ) {
      uVar9 = uVar8 + 1;
      uVar5 = uVar9;
      if (uVar9 == uVar3) {
        uVar5 = 0;
      }
      if (uVar5 == uVar6) break;
      uVar7 = uVar8 + 3;
      uVar10 = uVar3;
      if (uVar7 < uVar3) {
        uVar10 = 0;
      }
      if (puVar2[(int)(uVar7 - uVar10)] != threadId) break;
      uVar7 = uVar7 + puVar2[(int)uVar5];
      uVar8 = uVar3;
      if (uVar7 < uVar3) {
        uVar8 = 0;
      }
      uVar8 = uVar7 - uVar8;
    }
  }
  if (uVar9 == uVar3) {
    uVar9 = 0;
  }
  if (uVar9 == uVar6) {
    puVar1[local_38] = uVar8;
    bVar11 = false;
  }
  else {
    puVar1 = (this->elems).data;
    uVar6 = puVar1[(int)uVar9];
    if (uVar9 + 1 < uVar3) {
      uVar3 = 0;
    }
    iVar4 = (uVar9 - uVar3) + 1;
    uVar3 = puVar1[iVar4];
    puVar1[iVar4] = uVar3 - 1;
    uVar5 = 1;
    if (uVar9 + 1 != this->maxsize) {
      uVar5 = uVar9 + 2;
    }
    if (uVar5 == this->maxsize) {
      uVar5 = 0;
    }
    *threadOrigin = puVar1[(int)uVar5];
    if (resultClause->data != (Lit *)0x0) {
      resultClause->sz = 0;
    }
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
      uVar6 = uVar5 + 1;
      uVar5 = 0;
      if (uVar6 != this->maxsize) {
        uVar5 = uVar6;
      }
      local_3c.x = (this->elems).data[(int)uVar5];
      vec<Glucose::Lit>::push(resultClause,&local_3c);
    }
    if ((this->last == uVar8) && (uVar3 - 1 == 0)) {
      removeLastClause(this);
      uVar5 = this->last;
    }
    (this->lastOfThread).data[local_38] = uVar5;
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool ClausesBuffer::getClause(int threadId, int & threadOrigin, vec<Lit> & resultClause,  bool firstFound) {
    assert(lastOfThread.size() > threadId);
    unsigned int thislast = lastOfThread[threadId];
    assert(!firstFound || thislast == last); // FIXME: Gilles has this assertion on his cluster

    // Early exiting
    if (nextIndex(thislast) == first) return false;

    if ( ( thislast < last && last < first) ||
	    ( first < thislast && thislast < last ) ||
	    ( last < first && first < thislast) ) {
	// Special case where last has moved and lastOfThread[threadId] is no more valid (is behind)
	thislast = last; 
    }
    assert(!firstFound);
    // Go to next clause for this thread id
    if (!firstFound) { 
	while (nextIndex(thislast) != first && elems[addIndex(thislast,3)] == ((unsigned int)threadId)) { // 3 = 2 + 1 
	    thislast = addIndex(thislast, elems[nextIndex(thislast)] + headerSize); // 
	    assert(thislast >= 0);
	    assert(thislast < maxsize);
	}
	assert(nextIndex(thislast)==first || elems[addIndex(thislast,3)] != (unsigned int)threadId);
    }

    if (nextIndex(thislast) == first) {
	lastOfThread[threadId] = thislast;
	return false;
    }  
    assert(elems[addIndex(thislast,3)] != ((unsigned int) threadId));
    unsigned int previouslast = thislast;
    bool removeAfter = false;
    int csize = noCheckPop(thislast);
    removeAfter = (--elems[addIndex(thislast,1)] == 0); // We are sure this is not one of our own clause
    thislast = nextIndex(thislast); // Skips the removeAfter fieldr
    threadOrigin = noCheckPop(thislast);
    assert(threadOrigin != threadId);
    resultClause.clear();
    for(int i=0;i<csize;i++) {
	resultClause.push(toLit(noCheckPop(thislast)));
    }
    if (last == previouslast && removeAfter) {
	removeLastClause();
	thislast = last;
    }
    lastOfThread[threadId] = thislast;
    return true;
}